

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunningSection::~RunningSection(RunningSection *this)

{
  pointer ppRVar1;
  pointer pcVar2;
  
  deleteAll<std::vector<Catch::RunningSection*,std::allocator<Catch::RunningSection*>>>
            (&this->m_subSections);
  ppRVar1 = (this->m_subSections).
            super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppRVar1 != (pointer)0x0) {
    operator_delete(ppRVar1);
  }
  pcVar2 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_name).field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~RunningSection() {
            deleteAll( m_subSections );
        }